

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.h
# Opt level: O3

void ThrowXrResult(XrResult res,char *originator,char *sourceLocation)

{
  char *pcVar1;
  string sStack_38;
  
  pcVar1 = to_string(res);
  Fmt_abi_cxx11_(&sStack_38,"XrResult failure [%s]",pcVar1);
  Throw(&sStack_38,originator,sourceLocation);
}

Assistant:

[[noreturn]] inline void ThrowXrResult(XrResult res, const char* originator = nullptr, const char* sourceLocation = nullptr) {
    Throw(Fmt("XrResult failure [%s]", to_string(res)), originator, sourceLocation);
}